

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_sampler.cc
# Opt level: O1

QuicByteCount __thiscall
quic::MaxAckHeightTracker::Update
          (MaxAckHeightTracker *this,QuicBandwidth bandwidth_estimate,
          QuicRoundTripCount round_trip_count,QuicTime ack_time,QuicByteCount bytes_acked)

{
  QuicByteCount QVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  unsigned_long new_sample;
  undefined1 auVar5 [16];
  
  lVar2 = (this->aggregation_epoch_start_time_).time_;
  if (lVar2 != 0) {
    lVar3 = (ack_time.time_ - lVar2) * bandwidth_estimate.bits_per_second_;
    lVar2 = lVar3 + 7;
    if (-1 < lVar3) {
      lVar2 = lVar3;
    }
    QVar1 = this->aggregation_epoch_bytes_;
    auVar5._8_4_ = (int)(QVar1 >> 0x20);
    auVar5._0_8_ = QVar1;
    auVar5._12_4_ = 0x45300000;
    uVar4 = (ulong)(lVar2 >> 3) / 1000000;
    if ((double)uVar4 * this->ack_aggregation_bandwidth_threshold_ <
        (auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)QVar1) - 4503599627370496.0)) {
      this->aggregation_epoch_bytes_ = QVar1 + bytes_acked;
      new_sample = (QVar1 + bytes_acked) - uVar4;
      WindowedFilter<unsigned_long,_quic::MaxFilter<unsigned_long>,_unsigned_long,_unsigned_long>::
      Update(&this->max_ack_height_filter_,new_sample,round_trip_count);
      return new_sample;
    }
  }
  this->aggregation_epoch_bytes_ = bytes_acked;
  (this->aggregation_epoch_start_time_).time_ = ack_time.time_;
  this->num_ack_aggregation_epochs_ = this->num_ack_aggregation_epochs_ + 1;
  return 0;
}

Assistant:

QuicByteCount MaxAckHeightTracker::Update(QuicBandwidth bandwidth_estimate,
                                          QuicRoundTripCount round_trip_count,
                                          QuicTime ack_time,
                                          QuicByteCount bytes_acked) {
  if (aggregation_epoch_start_time_ == QuicTime::Zero()) {
    aggregation_epoch_bytes_ = bytes_acked;
    aggregation_epoch_start_time_ = ack_time;
    ++num_ack_aggregation_epochs_;
    return 0;
  }

  // Compute how many bytes are expected to be delivered, assuming max bandwidth
  // is correct.
  QuicByteCount expected_bytes_acked =
      bandwidth_estimate * (ack_time - aggregation_epoch_start_time_);
  // Reset the current aggregation epoch as soon as the ack arrival rate is less
  // than or equal to the max bandwidth.
  if (aggregation_epoch_bytes_ <=
      ack_aggregation_bandwidth_threshold_ * expected_bytes_acked) {
//    QUIC_DVLOG(3) << "Starting a new aggregation epoch because "
                  //   "aggregation_epoch_bytes_ "
                  //<< aggregation_epoch_bytes_
                  //<< " is smaller than expected. "
                  //   "ack_aggregation_bandwidth_threshold_:"
                  //<< ack_aggregation_bandwidth_threshold_
                  //<< ", expected_bytes_acked:" << expected_bytes_acked
                  //<< ", bandwidth_estimate:" << bandwidth_estimate
                  //<< ", aggregation_duration:"
                  //<< (ack_time - aggregation_epoch_start_time_)
                  //<< ", new_aggregation_epoch:" << ack_time
                  //<< ", new_aggregation_bytes_acked:" << bytes_acked;
    // Reset to start measuring a new aggregation epoch.
    aggregation_epoch_bytes_ = bytes_acked;
    aggregation_epoch_start_time_ = ack_time;
    ++num_ack_aggregation_epochs_;
    return 0;
  }

  aggregation_epoch_bytes_ += bytes_acked;

  // Compute how many extra bytes were delivered vs max bandwidth.
  QuicByteCount extra_bytes_acked =
      aggregation_epoch_bytes_ - expected_bytes_acked;
  //QUIC_DVLOG(3) << "Updating MaxAckHeight. ack_time:" << ack_time
  //              << ", round trip count:" << round_trip_count
  //              << ", bandwidth_estimate:" << bandwidth_estimate
  //              << ", bytes_acked:" << bytes_acked
  //              << ", expected_bytes_acked:" << expected_bytes_acked
  //              << ", aggregation_epoch_bytes_:" << aggregation_epoch_bytes_
  //              << ", extra_bytes_acked:" << extra_bytes_acked;
  max_ack_height_filter_.Update(extra_bytes_acked, round_trip_count);
  return extra_bytes_acked;
}